

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning_tree.cc
# Opt level: O3

void __thiscall VW::SpanningTree::Start(SpanningTree *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  future<void> *pfVar3;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  SpanningTree *local_28;
  SpanningTree *local_20;
  undefined8 local_18;
  
  if (this->m_future == (future<void> *)0x0) {
    pfVar3 = (future<void> *)operator_new(0x10);
    (pfVar3->super___basic_future<void>)._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pfVar3->super___basic_future<void>)._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this->m_future = pfVar3;
  }
  local_20 = (SpanningTree *)Run;
  local_18 = 0;
  local_28 = this;
  std::async<void(VW::SpanningTree::*)(),VW::SpanningTree*>
            ((launch)&local_38,(offset_in_SpanningTree_to_subr *)0x1,&local_20);
  p_Var2 = p_Stack_30;
  peVar1 = local_38;
  pfVar3 = this->m_future;
  local_38 = (element_type *)0x0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (pfVar3->super___basic_future<void>)._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (pfVar3->super___basic_future<void>)._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (pfVar3->super___basic_future<void>)._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
  }
  return;
}

Assistant:

void SpanningTree::Start()
{
  // launch async
  if (m_future == nullptr)
  {
    m_future = new future<void>;
  }

  *m_future = std::async(std::launch::async, &SpanningTree::Run, this);
}